

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddReord.c
# Opt level: O1

int zddReorderPostprocess(DdManager *table)

{
  uint uVar1;
  DdSubtable *pDVar2;
  DdNode **__ptr;
  ulong uVar3;
  DdNode *pDVar4;
  DdNode *pDVar5;
  _func_void_long *p_Var6;
  ulong uVar7;
  DdNode **__s;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  
  uVar7 = table->allocated;
  if ((table->reclaimed <= (double)((long)uVar7 / 2)) && (0 < table->sizeZ)) {
    lVar12 = 0;
    do {
      p_Var6 = Extra_UtilMMoutOfMemory;
      pDVar2 = table->subtableZ;
      uVar1 = pDVar2[lVar12].slots;
      uVar7 = 4;
      Extra_UtilMMoutOfMemory = p_Var6;
      if ((pDVar2[lVar12].keys << 3 <= uVar1) && (table->initSlots < uVar1)) {
        __ptr = pDVar2[lVar12].nodelist;
        uVar8 = uVar1 >> 1;
        Extra_UtilMMoutOfMemory = Cudd_OutOfMem;
        __s = (DdNode **)malloc((ulong)uVar8 * 8);
        if (__s == (DdNode **)0x0) {
          uVar7 = 1;
          Extra_UtilMMoutOfMemory = p_Var6;
        }
        else {
          Extra_UtilMMoutOfMemory = p_Var6;
          pDVar2[lVar12].nodelist = __s;
          pDVar2[lVar12].slots = uVar8;
          iVar10 = pDVar2[lVar12].shift + 1;
          pDVar2[lVar12].shift = iVar10;
          pDVar2[lVar12].maxKeys = uVar8 * 4;
          if (1 < uVar1) {
            memset(__s,0,(ulong)(uVar8 - 1) * 8 + 8);
          }
          uVar7 = 1;
          if (1 < uVar1) {
            uVar7 = (ulong)uVar1;
          }
          uVar9 = 0;
          do {
            pDVar5 = __ptr[uVar9];
            while (pDVar5 != (DdNode *)0x0) {
              uVar3 = *(ulong *)((long)&pDVar5->type + 8);
              uVar11 = (((uint)uVar3 & 1) + *(int *)((uVar3 & 0xfffffffffffffffe) + 0x20) * 2 +
                       (((uint)*(ulong *)&pDVar5->type & 1) +
                       *(int *)((*(ulong *)&pDVar5->type & 0xfffffffffffffffe) + 0x20) * 2) *
                       0xc00005) * 0x40f1f9 >> ((byte)iVar10 & 0x1f);
              pDVar4 = pDVar5->next;
              pDVar5->next = __s[(int)uVar11];
              __s[(int)uVar11] = pDVar5;
              pDVar5 = pDVar4;
            }
            uVar9 = uVar9 + 1;
          } while (uVar9 != uVar7);
          if (__ptr != (DdNode **)0x0) {
            free(__ptr);
          }
          table->memused = table->memused + (ulong)(uVar8 - uVar1) * 8;
          uVar8 = (uVar8 - uVar1) + table->slots;
          table->slots = uVar8;
          table->minDead = (uint)(long)((double)uVar8 * table->gcFrac);
          uVar1 = uVar8 * 4;
          if (table->maxCacheHard <= uVar8 * 4) {
            uVar1 = table->maxCacheHard;
          }
          table->cacheSlack = uVar1 + table->cacheSlots * -2;
          uVar7 = 0;
        }
      }
      if ((uVar7 & 3) != 0) break;
      lVar12 = lVar12 + 1;
      uVar7 = (ulong)table->sizeZ;
    } while (lVar12 < (long)uVar7);
  }
  return (int)uVar7;
}

Assistant:

static int
zddReorderPostprocess(
  DdManager * table)
{
    int i, j, posn;
    DdNodePtr *nodelist, *oldnodelist;
    DdNode *node, *next;
    unsigned int slots, oldslots;
    extern DD_OOMFP MMoutOfMemory;
    DD_OOMFP saveHandler;

#ifdef DD_VERBOSE
    (void) fflush(table->out);
#endif

    /* If we have very many reclaimed nodes, we do not want to shrink
    ** the subtables, because this will lead to more garbage
    ** collections. More garbage collections mean shorter mean life for
    ** nodes with zero reference count; hence lower probability of finding
    ** a result in the cache.
    */
    if (table->reclaimed > table->allocated / 2) return(1);

    /* Resize subtables. */
    for (i = 0; i < table->sizeZ; i++) {
        int shift;
        oldslots = table->subtableZ[i].slots;
        if (oldslots < table->subtableZ[i].keys * DD_MAX_SUBTABLE_SPARSITY ||
            oldslots <= table->initSlots) continue;
        oldnodelist = table->subtableZ[i].nodelist;
        slots = oldslots >> 1;
        saveHandler = MMoutOfMemory;
        MMoutOfMemory = Cudd_OutOfMem;
        nodelist = ABC_ALLOC(DdNodePtr, slots);
        MMoutOfMemory = saveHandler;
        if (nodelist == NULL) {
            return(1);
        }
        table->subtableZ[i].nodelist = nodelist;
        table->subtableZ[i].slots = slots;
        table->subtableZ[i].shift++;
        table->subtableZ[i].maxKeys = slots * DD_MAX_SUBTABLE_DENSITY;
#ifdef DD_VERBOSE
        (void) fprintf(table->err,
                       "shrunk layer %d (%d keys) from %d to %d slots\n",
                       i, table->subtableZ[i].keys, oldslots, slots);
#endif

        for (j = 0; (unsigned) j < slots; j++) {
            nodelist[j] = NULL;
        }
        shift = table->subtableZ[i].shift;
        for (j = 0; (unsigned) j < oldslots; j++) {
            node = oldnodelist[j];
            while (node != NULL) {
                next = node->next;
                posn = ddHash(cuddF2L(cuddT(node)), cuddF2L(cuddE(node)), shift);
                node->next = nodelist[posn];
                nodelist[posn] = node;
                node = next;
            }
        }
        ABC_FREE(oldnodelist);

        table->memused += (slots - oldslots) * sizeof(DdNode *);
        table->slots += slots - oldslots;
        table->minDead = (unsigned) (table->gcFrac * (double) table->slots);
        table->cacheSlack = (int) ddMin(table->maxCacheHard,
            DD_MAX_CACHE_TO_SLOTS_RATIO*table->slots) -
            2 * (int) table->cacheSlots;
    }
    /* We don't look at the constant subtable, because it is not
    ** affected by reordering.
    */

    return(1);

}